

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.h
# Opt level: O0

void __thiscall VCToolBase::parseOptions(VCToolBase *this,ProStringList *options)

{
  bool bVar1;
  const_iterator o;
  char *pcVar2;
  ProString *in_RSI;
  QList<ProString> *in_RDI;
  long in_FS_OFFSET;
  ConstIterator it;
  int in_stack_ffffffffffffffac;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.i = (ProString *)0xaaaaaaaaaaaaaaaa;
  local_10 = QList<ProString>::begin(in_RDI);
  while( true ) {
    o = QList<ProString>::end(in_RDI);
    bVar1 = QList<ProString>::const_iterator::operator!=(&local_10,o);
    if (!bVar1) break;
    QList<ProString>::const_iterator::operator*(&local_10);
    ProString::toLatin1(in_RSI);
    pcVar2 = QByteArray::constData((QByteArray *)0x2989fa);
    (**(code **)&(in_RDI->d).d[1].super_QArrayData)(in_RDI,pcVar2);
    QByteArray::~QByteArray((QByteArray *)0x298a12);
    QList<ProString>::const_iterator::operator++((const_iterator *)in_RDI,in_stack_ffffffffffffffac)
    ;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void parseOptions(const ProStringList& options) {
        for (ProStringList::ConstIterator it=options.begin(); (it!=options.end()); it++)
            parseOption((*it).toLatin1().constData());
    }